

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOSystem.hpp
# Opt level: O0

string * __thiscall Assimp::IOSystem::CurrentDirectory_abi_cxx11_(IOSystem *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  allocator<char> local_19;
  IOSystem *local_18;
  IOSystem *this_local;
  
  local_18 = this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->m_pathStack);
  if (bVar1) {
    if (CurrentDirectory[abi:cxx11]()::Dummy_abi_cxx11_ == '\0') {
      iVar2 = __cxa_guard_acquire(&CurrentDirectory[abi:cxx11]()::Dummy_abi_cxx11_);
      if (iVar2 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&CurrentDirectory[abi:cxx11]()::Dummy_abi_cxx11_,"",&local_19);
        std::allocator<char>::~allocator(&local_19);
        __cxa_atexit(std::__cxx11::string::~string,&CurrentDirectory[abi:cxx11]()::Dummy_abi_cxx11_,
                     &__dso_handle);
        __cxa_guard_release(&CurrentDirectory[abi:cxx11]()::Dummy_abi_cxx11_);
      }
    }
    this_local = (IOSystem *)&CurrentDirectory[abi:cxx11]()::Dummy_abi_cxx11_;
  }
  else {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->m_pathStack);
    this_local = (IOSystem *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->m_pathStack,sVar3 - 1);
  }
  return (string *)this_local;
}

Assistant:

AI_FORCE_INLINE
const std::string &IOSystem::CurrentDirectory() const {
    if ( m_pathStack.empty() ) {
        static const std::string Dummy("");
        return Dummy;
    }
    return m_pathStack[ m_pathStack.size()-1 ];
}